

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::checker(Solver *this,int argc,char **argv)

{
  bool bVar1;
  invalid_argument *e;
  char **in_stack_000007c0;
  int in_stack_000007c8;
  bool in_stack_000007cf;
  Checker *in_stack_000007d0;
  allocator *out;
  allocator local_49;
  string local_48 [8];
  HyperParam *in_stack_ffffffffffffffc0;
  Checker *in_stack_ffffffffffffffc8;
  
  Checker::Initialize(in_stack_000007d0,in_stack_000007cf,in_stack_000007c8,in_stack_000007c0);
  bVar1 = Checker::check_cmd(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (!bVar1) {
    out = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Arguments error",out);
    Color::print_error((string *)out);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    exit(0);
  }
  return;
}

Assistant:

void Solver::checker(int argc, char* argv[]) {
  try {
    checker_.Initialize(hyper_param_.is_train, argc, argv);
    if (!checker_.check_cmd(hyper_param_)) {
      Color::print_error("Arguments error");
      exit(0);
    }
  } catch (std::invalid_argument &e) {
    printf("%s\n", e.what());
    exit(1);
  }
}